

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::handleUnaryMath
          (TParseContext *this,TSourceLoc *loc,char *str,TOperator op,TIntermTyped *childNode)

{
  char *op_00;
  char *loc_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TString local_78;
  undefined1 local_49;
  TParseContext *pTStack_48;
  bool enhanced;
  TIntermTyped *result;
  TParseContext *pTStack_38;
  bool allowed;
  TIntermTyped *childNode_local;
  char *pcStack_28;
  TOperator op_local;
  char *str_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  pTStack_38 = (TParseContext *)childNode;
  childNode_local._4_4_ = op;
  pcStack_28 = str;
  str_local = (char *)loc;
  loc_local = (TSourceLoc *)this;
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])
            (this,loc,str,childNode);
  result._7_1_ = 1;
  iVar2 = (*(pTStack_38->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e])()
  ;
  bVar1 = TType::contains16BitFloat((TType *)CONCAT44(extraout_var,iVar2));
  if ((!bVar1) ||
     (uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x14])(),
     (uVar3 & 1) != 0)) {
    iVar2 = (*(pTStack_38->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e])
                      ();
    bVar1 = TType::contains16BitInt((TType *)CONCAT44(extraout_var_00,iVar2));
    if ((!bVar1) ||
       (uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x17])()
       , (uVar3 & 1) != 0)) {
      iVar2 = (*(pTStack_38->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                [0x1e])();
      bVar1 = TType::contains8BitInt((TType *)CONCAT44(extraout_var_01,iVar2));
      if ((!bVar1) ||
         (uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1a])
                            (), (uVar3 & 1) != 0)) goto LAB_0075119b;
    }
  }
  result._7_1_ = 0;
LAB_0075119b:
  pTStack_48 = (TParseContext *)0x0;
  if ((result._7_1_ & 1) != 0) {
    pTStack_48 = (TParseContext *)
                 TIntermediate::addUnaryMath
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            childNode_local._4_4_,(TIntermTyped *)pTStack_38,(TSourceLoc *)str_local
                           );
  }
  if (pTStack_48 == (TParseContext *)0x0) {
    local_49 = TIntermediate::getEnhancedMsgs
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    loc_00 = str_local;
    op_00 = pcStack_28;
    TIntermTyped::getCompleteString_abi_cxx11_(&local_78,(TIntermTyped *)pTStack_38,(bool)local_49);
    unaryOpError(this,(TSourceLoc *)loc_00,op_00,&local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_78);
    this_local = pTStack_38;
  }
  else {
    this_local = pTStack_48;
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::handleUnaryMath(const TSourceLoc& loc, const char* str, TOperator op, TIntermTyped* childNode)
{
    rValueErrorCheck(loc, str, childNode);

    bool allowed = true;
    if ((childNode->getType().contains16BitFloat() && !float16Arithmetic()) ||
        (childNode->getType().contains16BitInt() && !int16Arithmetic()) ||
        (childNode->getType().contains8BitInt() && !int8Arithmetic())) {
        allowed = false;
    }

    TIntermTyped* result = nullptr;
    if (allowed)
        result = intermediate.addUnaryMath(op, childNode, loc);

    if (result)
        return result;
    else {
        bool enhanced = intermediate.getEnhancedMsgs();
        unaryOpError(loc, str, childNode->getCompleteString(enhanced));
    }

    return childNode;
}